

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpEncoder::setNumBands(BmpEncoder *this,uint bands)

{
  int in_ESI;
  char *in_RDI;
  undefined1 unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  char *message;
  
  message = in_RDI;
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x27d) & 1) != 0) {
    throw_precondition_error
              ((bool)unaff_retaddr,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20));
  }
  throw_precondition_error
            ((bool)unaff_retaddr,message,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  *(bool *)(*(long *)(in_RDI + 8) + 0x27c) = in_ESI == 1;
  return;
}

Assistant:

void BmpEncoder::setNumBands( unsigned int bands )
{
    VIGRA_IMPEX_FINALIZED(pimpl->finalized);
    vigra_precondition( ( bands == 1 ) || ( bands == 3 ),
                        "bmp supports only rgb and grayscale images" );
    pimpl->grayscale = ( bands == 1 );
}